

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

IterRange<kj::_::BTreeImpl::Iterator> * __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
range<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4],char_const(&)[4]>
          (IterRange<kj::_::BTreeImpl::Iterator> *__return_storage_ptr__,
          TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,char (*begin) [4],char (*end) [4])

{
  StringPtr *local_98;
  size_t local_90;
  Iterator local_88;
  SearchKey local_70;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *local_68;
  StringPtr **local_60;
  char (*local_58) [4];
  SearchKey local_50;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *local_48;
  StringPtr **local_40;
  char (*local_38) [4];
  
  local_90 = table.size_;
  local_98 = table.ptr;
  local_50._vptr_SearchKey = (_func_int **)&PTR_search_001c70e8;
  local_48 = this;
  local_40 = &local_98;
  local_38 = begin;
  _::BTreeImpl::search(&local_88,(BTreeImpl *)(this + 8),&local_50);
  local_70._vptr_SearchKey = (_func_int **)&PTR_search_001c70e8;
  local_68 = this;
  local_60 = &local_98;
  local_58 = end;
  _::BTreeImpl::search(&__return_storage_ptr__->e,(BTreeImpl *)(this + 8),&local_70);
  (__return_storage_ptr__->b).row = local_88.row;
  *(undefined4 *)&(__return_storage_ptr__->b).field_0x14 = local_88._20_4_;
  (__return_storage_ptr__->b).tree = local_88.tree;
  (__return_storage_ptr__->b).leaf = local_88.leaf;
  return __return_storage_ptr__;
}

Assistant:

_::IterRange<_::BTreeImpl::Iterator> range(
      kj::ArrayPtr<Row> table, Begin&& begin, End&& end) const {
    return {
      impl.search(searchKey(table, begin)),
      impl.search(searchKey(table, end  ))
    };
  }